

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mddglobals.cpp
# Opt level: O2

void mdd_table(vec<IntVar_*> *x,vec<vec<int>_> *t,MDDOpts *mopts)

{
  MDDNodeInt b;
  MDDNodeInt m;
  uint i;
  ulong uVar1;
  MDDNodeInt table;
  long lVar2;
  MDDTable tab;
  vec<int> local_f8;
  MDDTable local_e0;
  
  local_f8.sz = 0;
  local_f8.cap = 0;
  local_f8.data = (int *)0x0;
  for (uVar1 = 0; uVar1 < x->sz; uVar1 = uVar1 + 1) {
    local_e0.nvars = (x->data[uVar1]->max).v + 1;
    vec<int>::push(&local_f8,&local_e0.nvars);
  }
  MDDTable::MDDTable(&local_e0,x->sz);
  lVar2 = 0;
  m = 0;
  for (uVar1 = 0; uVar1 < t->sz; uVar1 = uVar1 + 1) {
    b = MDDTable::tuple<int>(&local_e0,(vec<int> *)((long)&t->data->sz + lVar2));
    m = MDDTable::mdd_or(&local_e0,m,b);
    lVar2 = lVar2 + 0x10;
  }
  addMDDProp(x,&local_e0,m,mopts);
  MDDTable::~MDDTable(&local_e0);
  free(local_f8.data);
  return;
}

Assistant:

void mdd_table(vec<IntVar*>& x, vec<vec<int> >& t, const MDDOpts& mopts) {
	vec<int> doms;

	int maxdom = 0;
	for (unsigned int i = 0; i < x.size(); i++) {
		// assert(x[i]->getMin() == 0);
		doms.push(x[i]->getMax() + 1);

		// Could also generate maxdom from tuples.
		if ((x[i]->getMax() + 1) > maxdom) {
			maxdom = x[i]->getMax() + 1;
		}
	}
	MDDTable tab(x.size());

	// Assumes a positive table.
	const MDDNodeInt m(mdd_table(tab, x.size(), doms, t, true));

	//   tab.print_mdd_tikz(m);

	addMDDProp(x, tab, m, mopts);
}